

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O1

int luaB_getmetatable(lua_State *L)

{
  int iVar1;
  
  luaL_checkany(L,1);
  iVar1 = lua_getmetatable(L,1);
  if (iVar1 == 0) {
    lua_pushnil(L);
  }
  else {
    luaL_getmetafield(L,1,"__metatable");
  }
  return 1;
}

Assistant:

static int luaB_getmetatable (lua_State *L) {
  luaL_checkany(L, 1);
  if (!lua_getmetatable(L, 1)) {
    lua_pushnil(L);
    return 1;  /* no metatable */
  }
  luaL_getmetafield(L, 1, "__metatable");
  return 1;  /* returns either __metatable field (if present) or metatable */
}